

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

settings_pack *
libtorrent::load_pack_from_dict(settings_pack *__return_storage_ptr__,bdecode_node *settings)

{
  char *pcVar1;
  char *pcVar2;
  size_t __n;
  size_t __n_00;
  int iVar3;
  type_t tVar4;
  int iVar5;
  size_t sVar6;
  int64_t iVar7;
  size_type __rlen_2;
  int i;
  size_type __rlen;
  long lVar8;
  undefined8 *puVar9;
  string_view sVar10;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  (__return_storage_ptr__->super_settings_interface)._vptr_settings_interface =
       (_func_int **)&PTR_set_str_004f5058;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  i = 0;
  do {
    iVar3 = bdecode_node::dict_size(settings);
    if (iVar3 <= i) {
      return __return_storage_ptr__;
    }
    bdecode_node::dict_at(&local_80,settings,i);
    tVar4 = bdecode_node::type(&local_80.second);
    pcVar2 = local_80.first._M_str;
    __n = local_80.first._M_len;
    if (tVar4 == string_t) {
      puVar9 = &(anonymous_namespace)::str_settings;
      lVar8 = 0;
      do {
        pcVar1 = (char *)*puVar9;
        sVar6 = strlen(pcVar1);
        if ((__n == sVar6) && ((__n == 0 || (iVar3 = bcmp(pcVar2,pcVar1,__n), iVar3 == 0)))) {
          sVar10 = bdecode_node::string_value(&local_80.second);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,sVar10._M_str,sVar10._M_str + sVar10._M_len);
          settings_pack::set_str(__return_storage_ptr__,(int)lVar8,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        lVar8 = lVar8 + 1;
        puVar9 = puVar9 + 7;
      } while (lVar8 != 0xd);
    }
    else if (tVar4 == int_t) {
      iVar3 = 0x4000;
      lVar8 = 0;
      do {
        pcVar1 = *(char **)((long)&(anonymous_namespace)::int_settings + lVar8);
        sVar6 = strlen(pcVar1);
        if ((__n == sVar6) && ((__n == 0 || (iVar5 = bcmp(pcVar2,pcVar1,__n), iVar5 == 0)))) {
          iVar7 = bdecode_node::int_value(&local_80.second);
          settings_pack::set_int(__return_storage_ptr__,iVar3,(int)iVar7);
          goto LAB_00300207;
        }
        pcVar1 = local_80.first._M_str;
        __n_00 = local_80.first._M_len;
        iVar3 = iVar3 + 1;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x13e0);
      iVar3 = 0x8000;
      lVar8 = 0;
      do {
        pcVar2 = *(char **)((long)&(anonymous_namespace)::bool_settings + lVar8);
        sVar6 = strlen(pcVar2);
        if ((__n_00 == sVar6) && ((__n_00 == 0 || (iVar5 = bcmp(pcVar1,pcVar2,__n_00), iVar5 == 0)))
           ) {
          iVar7 = bdecode_node::int_value(&local_80.second);
          settings_pack::set_bool(__return_storage_ptr__,iVar3,iVar7 != 0);
          break;
        }
        iVar3 = iVar3 + 1;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0xa80);
    }
LAB_00300207:
    if (local_80.second.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.second.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    i = i + 1;
  } while( true );
}

Assistant:

settings_pack load_pack_from_dict(bdecode_node const& settings)
	{
		settings_pack pack;

		for (int i = 0; i < settings.dict_size(); ++i)
		{
			auto const [key, val] = settings.dict_at(i);
			switch (val.type())
			{
				case bdecode_node::dict_t:
				case bdecode_node::list_t:
					continue;
				case bdecode_node::int_t:
				{
					bool found = false;
					for (int k = 0; k < int_settings.end_index(); ++k)
					{
						if (key != int_settings[k].name) continue;
						pack.set_int(settings_pack::int_type_base | k, int(val.int_value()));
						found = true;
						break;
					}
					if (found) continue;
					for (int k = 0; k < bool_settings.end_index(); ++k)
					{
						if (key != bool_settings[k].name) continue;
						pack.set_bool(settings_pack::bool_type_base | k, val.int_value() != 0);
						break;
					}
				}
				break;
			case bdecode_node::string_t:
				for (int k = 0; k < str_settings.end_index(); ++k)
				{
					if (key != str_settings[k].name) continue;
					pack.set_str(settings_pack::string_type_base + k, std::string(val.string_value()));
					break;
				}
				break;
			case bdecode_node::none_t:
				break;
			}
		}
		return pack;
	}